

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

void * select_init(event_base *base)

{
  int iVar1;
  selectop *sop;
  event_base *base_local;
  
  base_local = (event_base *)event_mm_calloc_(1,0x30);
  if (base_local == (event_base *)0x0) {
    base_local = (event_base *)0x0;
  }
  else {
    iVar1 = select_resize((selectop *)base_local,8);
    if (iVar1 == 0) {
      evsig_init_(base);
      evutil_weakrand_seed_(&base->weakrand_seed,0);
    }
    else {
      select_free_selectop((selectop *)base_local);
      base_local = (event_base *)0x0;
    }
  }
  return base_local;
}

Assistant:

static void *
select_init(struct event_base *base)
{
	struct selectop *sop;

	if (!(sop = mm_calloc(1, sizeof(struct selectop))))
		return (NULL);

	if (select_resize(sop, SELECT_ALLOC_SIZE(32 + 1))) {
		select_free_selectop(sop);
		return (NULL);
	}

	evsig_init_(base);

	evutil_weakrand_seed_(&base->weakrand_seed, 0);

	return (sop);
}